

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::correctionResidual
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *resid,MultiFab *x,MultiFab *b,
          BCMode bc_mode,MultiFab *crse_bcdata)

{
  undefined4 uVar1;
  pointer pMVar2;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  MultiFab *in_R8;
  Real in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int ncomp;
  char *in_stack_00000158;
  int in_stack_00000164;
  char *in_stack_00000168;
  char *in_stack_00000170;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  *in_stack_ffffffffffffff40;
  MultiFab *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  long *plVar3;
  int amrlev_00;
  MLCellLinOp *in_stack_ffffffffffffffa0;
  
  plVar3 = in_RDI;
  uVar1 = (**(code **)(*in_RDI + 0x28))();
  amrlev_00 = (int)((ulong)plVar3 >> 0x20);
  if (in_stack_00000008 == 1) {
    in_stack_ffffffffffffff60 = in_R8;
    if (in_stack_00000010 != 0) {
      if (in_EDX != 0) {
        Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
        in_stack_ffffffffffffff60 = in_R8;
      }
      if (in_ESI < 1) {
        Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
      }
      updateCorBC(in_stack_ffffffffffffffa0,amrlev_00,(MultiFab *)CONCAT44(in_ESI,in_EDX));
    }
    in_R8 = in_stack_ffffffffffffff60;
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[](in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pMVar2 = std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::get
                       ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                        in_stack_ffffffffffffff40);
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_ESI,in_EDX,in_RCX,in_stack_ffffffffffffff60,1,1,pMVar2);
  }
  else {
    if (in_stack_00000010 != 0) {
      Assert_host(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000158);
    }
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_ESI,in_EDX,in_RCX,in_R8,0,1,0);
  }
  MultiFab::Xpay(in_R8,in_R9,(MultiFab *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void
MLCellLinOp::correctionResidual (int amrlev, int mglev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                                 BCMode bc_mode, const MultiFab* crse_bcdata)
{
    BL_PROFILE("MLCellLinOp::correctionResidual()");
    const int ncomp = getNComp();
    if (bc_mode == BCMode::Inhomogeneous)
    {
        if (crse_bcdata)
        {
            AMREX_ALWAYS_ASSERT(mglev == 0);
            AMREX_ALWAYS_ASSERT(amrlev > 0);
            updateCorBC(amrlev, *crse_bcdata);
        }
        apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Correction,
              m_bndry_cor[amrlev].get());
    }
    else
    {
        AMREX_ALWAYS_ASSERT(crse_bcdata == nullptr);
        apply(amrlev, mglev, resid, x, BCMode::Homogeneous, StateMode::Correction, nullptr);
    }

    MultiFab::Xpay(resid, Real(-1.0), b, 0, 0, ncomp, 0);
}